

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

void ZSTD_opt_getNextMatchAndUpdateSeqStore
               (ZSTD_optLdm_t *optLdm,U32 currPosInBlock,U32 blockBytesRemaining)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  rawSeq *prVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  uVar2 = (optLdm->seqStore).size;
  if ((uVar2 != 0) && (uVar3 = (optLdm->seqStore).pos, uVar3 < uVar2)) {
    prVar4 = (optLdm->seqStore).seq;
    uVar2 = (optLdm->seqStore).posInSequence;
    uVar5 = prVar4[uVar3].litLength - (int)uVar2;
    uVar7 = 0;
    if (uVar2 < prVar4[uVar3].litLength) {
      uVar7 = uVar5;
    }
    if (uVar7 != 0) {
      uVar5 = 0;
    }
    if (uVar7 < blockBytesRemaining) {
      iVar6 = uVar5 + prVar4[uVar3].matchLength;
      UVar1 = prVar4[uVar3].offset;
      optLdm->startPosInBlock = currPosInBlock + uVar7;
      uVar5 = currPosInBlock + uVar7 + iVar6;
      optLdm->endPosInBlock = uVar5;
      optLdm->offset = UVar1;
      if (uVar5 <= blockBytesRemaining + currPosInBlock) {
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)(iVar6 + uVar7));
        return;
      }
      optLdm->endPosInBlock = blockBytesRemaining + currPosInBlock;
    }
    else {
      optLdm->startPosInBlock = 0xffffffff;
      optLdm->endPosInBlock = 0xffffffff;
    }
    ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore,(ulong)blockBytesRemaining);
    return;
  }
  optLdm->startPosInBlock = 0xffffffff;
  optLdm->endPosInBlock = 0xffffffff;
  return;
}

Assistant:

static void ZSTD_opt_getNextMatchAndUpdateSeqStore(ZSTD_optLdm_t* optLdm, U32 currPosInBlock,
                                                   U32 blockBytesRemaining) {
    rawSeq currSeq;
    U32 currBlockEndPos;
    U32 literalsBytesRemaining;
    U32 matchBytesRemaining;

    /* Setting match end position to MAX to ensure we never use an LDM during this block */
    if (optLdm->seqStore.size == 0 || optLdm->seqStore.pos >= optLdm->seqStore.size) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        return;
    }
    /* Calculate appropriate bytes left in matchLength and litLength after adjusting
       based on ldmSeqStore->posInSequence */
    currSeq = optLdm->seqStore.seq[optLdm->seqStore.pos];
    assert(optLdm->seqStore.posInSequence <= currSeq.litLength + currSeq.matchLength);
    currBlockEndPos = currPosInBlock + blockBytesRemaining;
    literalsBytesRemaining = (optLdm->seqStore.posInSequence < currSeq.litLength) ?
            currSeq.litLength - (U32)optLdm->seqStore.posInSequence :
            0;
    matchBytesRemaining = (literalsBytesRemaining == 0) ?
            currSeq.matchLength - ((U32)optLdm->seqStore.posInSequence - currSeq.litLength) :
            currSeq.matchLength;

    /* If there are more literal bytes than bytes remaining in block, no ldm is possible */
    if (literalsBytesRemaining >= blockBytesRemaining) {
        optLdm->startPosInBlock = UINT_MAX;
        optLdm->endPosInBlock = UINT_MAX;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, blockBytesRemaining);
        return;
    }

    /* Matches may be < MINMATCH by this process. In that case, we will reject them
       when we are deciding whether or not to add the ldm */
    optLdm->startPosInBlock = currPosInBlock + literalsBytesRemaining;
    optLdm->endPosInBlock = optLdm->startPosInBlock + matchBytesRemaining;
    optLdm->offset = currSeq.offset;

    if (optLdm->endPosInBlock > currBlockEndPos) {
        /* Match ends after the block ends, we can't use the whole match */
        optLdm->endPosInBlock = currBlockEndPos;
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, currBlockEndPos - currPosInBlock);
    } else {
        /* Consume nb of bytes equal to size of sequence left */
        ZSTD_optLdm_skipRawSeqStoreBytes(&optLdm->seqStore, literalsBytesRemaining + matchBytesRemaining);
    }
}